

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_ssse3.c
# Opt level: O2

void aom_smooth_predictor_8x16_ssse3(uint8_t *dst,ptrdiff_t stride,uint8_t *above,uint8_t *left)

{
  __m128i ww [2];
  longlong local_b8 [8];
  __m128i pixels [4];
  
  load_pixel_w8(above,left,0x10,pixels);
  ww[0][0] = 0x3b00c5000100ff;
  ww[0][1] = 0x970069006e0092;
  ww[1][0] = 0xce003200b70049;
  ww[1][1] = 0xe0002000db0025;
  local_b8[0] = 0xaa00c400e100ff;
  local_b8[1] = 0x540066007b0091;
  local_b8[2] = 0x56003c001f0001;
  local_b8[3] = 0xac009a0085006f;
  local_b8[4] = 0x21002b00360044;
  local_b8[5] = 0x1000110014001a;
  local_b8[6] = 0xdf00d500ca00bc;
  local_b8[7] = 0xf000ef00ec00e6;
  smooth_pred_8xh(pixels,(__m128i *)local_b8,ww,8,dst,stride,0);
  smooth_pred_8xh(pixels,(__m128i *)(local_b8 + 4),ww,8,dst + stride * 8,stride,1);
  return;
}

Assistant:

void aom_smooth_predictor_8x16_ssse3(uint8_t *dst, ptrdiff_t stride,
                                     const uint8_t *above,
                                     const uint8_t *left) {
  __m128i pixels[4];
  load_pixel_w8(above, left, 16, pixels);

  __m128i wh[4], ww[2];
  load_weight_w8(16, wh, ww);

  smooth_pred_8xh(pixels, wh, ww, 8, dst, stride, 0);
  dst += stride << 3;
  smooth_pred_8xh(pixels, &wh[2], ww, 8, dst, stride, 1);
}